

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

Quat4f __thiscall Quat4f::lerp(Quat4f *this,Quat4f *q0,Quat4f *q1,float alpha)

{
  Quat4f *q;
  float fVar1;
  float fVar2;
  float fVar3;
  Quat4f QVar4;
  
  QVar4.m_elements[0] = alpha * (q1->m_elements[0] - q0->m_elements[0]) + q0->m_elements[0];
  QVar4.m_elements[1] = alpha * (q1->m_elements[1] - q0->m_elements[1]) + q0->m_elements[1];
  fVar1 = alpha * (q1->m_elements[2] - q0->m_elements[2]) + q0->m_elements[2];
  fVar2 = alpha * (q1->m_elements[3] - q0->m_elements[3]) + q0->m_elements[3];
  QVar4.m_elements[2] =
       SQRT(fVar2 * fVar2 +
            fVar1 * fVar1 +
            QVar4.m_elements[0] * QVar4.m_elements[0] + QVar4.m_elements[1] * QVar4.m_elements[1]);
  fVar3 = 1.0 / QVar4.m_elements[2];
  this->m_elements[0] = fVar3 * QVar4.m_elements[0];
  this->m_elements[1] = fVar3 * QVar4.m_elements[1];
  this->m_elements[2] = fVar3 * fVar1;
  this->m_elements[3] = fVar3 * fVar2;
  QVar4.m_elements[3] = 0.0;
  return (Quat4f)QVar4.m_elements;
}

Assistant:

Quat4f Quat4f::lerp( const Quat4f& q0, const Quat4f& q1, float alpha )
{
	return( ( q0 + alpha * ( q1 - q0 ) ).normalized() );
}